

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_tree.c
# Opt level: O0

yajl_val yajl_tree_parse(char *input,char *error_buffer,size_t error_buffer_size)

{
  yajl_status yVar1;
  yajl_handle h;
  uchar *puVar2;
  size_t in_RDX;
  yajl_callbacks *in_RSI;
  yajl_handle in_RDI;
  context_t ctx;
  char *internal_err_str;
  yajl_status status;
  yajl_handle handle;
  yajl_handle pyVar3;
  size_t in_stack_ffffffffffffff90;
  yajl_handle jsonText;
  int verbose;
  void *in_stack_ffffffffffffffa8;
  yajl_val in_stack_ffffffffffffffb0;
  yajl_callbacks *__s;
  yajl_val local_8;
  
  memset(&stack0xffffffffffffffa8,0,0x20);
  __s = in_RSI;
  if (in_RSI != (yajl_callbacks *)0x0) {
    memset(in_RSI,0,in_RDX);
  }
  h = yajl_alloc(in_RSI,(yajl_alloc_funcs *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  yajl_config(h,yajl_allow_comments);
  pyVar3 = h;
  jsonText = in_RDI;
  strlen((char *)in_RDI);
  yajl_parse(in_RDI,(uchar *)pyVar3,in_stack_ffffffffffffff90);
  verbose = (int)((ulong)pyVar3 >> 0x20);
  yVar1 = yajl_complete_parse((yajl_handle)0x10254c);
  if (yVar1 == yajl_status_ok) {
    yajl_free((yajl_handle)0x1025f8);
    local_8 = in_stack_ffffffffffffffb0;
  }
  else {
    if ((__s != (yajl_callbacks *)0x0) && (in_RDX != 0)) {
      pyVar3 = h;
      strlen((char *)jsonText);
      puVar2 = yajl_get_error(in_RDI,verbose,(uchar *)jsonText,(size_t)pyVar3);
      snprintf((char *)__s,in_RDX,"%s",puVar2);
      (*(h->alloc).free)((h->alloc).ctx,puVar2);
    }
    yajl_free((yajl_handle)0x1025e3);
    local_8 = (yajl_val)0x0;
  }
  return local_8;
}

Assistant:

yajl_val yajl_tree_parse (const char *input,
                          char *error_buffer, size_t error_buffer_size)
{
    static const yajl_callbacks callbacks =
        {
            /* null        = */ handle_null,
            /* boolean     = */ handle_boolean,
            /* integer     = */ NULL,
            /* double      = */ NULL,
            /* number      = */ handle_number,
            /* string      = */ handle_string,
            /* start map   = */ handle_start_map,
            /* map key     = */ handle_string,
            /* end map     = */ handle_end_map,
            /* start array = */ handle_start_array,
            /* end array   = */ handle_end_array
        };

    yajl_handle handle;
    yajl_status status;
    char * internal_err_str;
	context_t ctx = { NULL, NULL, NULL, 0 };

	ctx.errbuf = error_buffer;
	ctx.errbuf_size = error_buffer_size;

    if (error_buffer != NULL)
        memset (error_buffer, 0, error_buffer_size);

    handle = yajl_alloc (&callbacks, NULL, &ctx);
    yajl_config(handle, yajl_allow_comments, 1);

    status = yajl_parse(handle,
                        (const unsigned char *) input,
                        strlen (input));
    status = yajl_complete_parse (handle);
    if (status != yajl_status_ok) {
        if (error_buffer != NULL && error_buffer_size > 0) {
               internal_err_str = (char *) yajl_get_error(handle, 1,
                     (const unsigned char *) input,
                     strlen(input));
             snprintf(error_buffer, error_buffer_size, "%s", internal_err_str);
             YA_FREE(&(handle->alloc), internal_err_str);
        }
        yajl_free (handle);
        return NULL;
    }

    yajl_free (handle);
    return (ctx.root);
}